

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_noise_bits(fitsfile *fptr,int noisebits,int *status)

{
  int *in_RDX;
  int in_ESI;
  fitsfile *in_RDI;
  double dVar1;
  float qlevel;
  undefined4 local_4;
  
  if ((in_ESI < 1) || (0x10 < in_ESI)) {
    *in_RDX = 0x19d;
    ffpmsg((char *)0x1eb8c7);
    local_4 = *in_RDX;
  }
  else {
    dVar1 = pow(2.0,(double)in_ESI);
    fits_set_quantize_level(in_RDI,(float)dVar1,in_RDX);
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int fits_set_noise_bits(fitsfile *fptr,  /* I - FITS file pointer   */
           int noisebits,       /* noise_bits parameter value       */
                                /* (default = 4)                    */
           int *status)         /* IO - error status                */
{
/*
   ********************************************************************
   ********************************************************************
   THIS ROUTINE IS PROVIDED ONLY FOR BACKWARDS COMPATIBILITY;
   ALL NEW SOFTWARE SHOULD CALL fits_set_quantize_level INSTEAD
   ********************************************************************
   ********************************************************************

   This routine specifies the value of the noice_bits parameter that
   should be used when compressing floating point images.  The image is
   divided into tiles, and each tile is compressed and stored in a row
   of at variable length binary table column.

   Feb 2008:  the "noisebits" parameter has been replaced with the more
   general "quantize level" parameter.
*/
    float qlevel;

    if (noisebits < 1 || noisebits > 16)
    {
        *status = DATA_COMPRESSION_ERR;
	ffpmsg("illegal number of noise bits (fits_set_noise_bits)");
        return(*status);
    }

    qlevel = (float) pow (2., (double)noisebits);
    fits_set_quantize_level(fptr, qlevel, status);
    
    return(*status);
}